

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum.cpp
# Opt level: O0

Instrument *
Timidity::load_instrument
          (Renderer *song,char *name,int percussion,int panning,int note_to_use,int strip_loop,
          int strip_envelope,int strip_tail)

{
  uchar uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  Instrument *this;
  Sample *pSVar5;
  sample_t *psVar6;
  int local_1c0;
  int t;
  int k;
  FString local_1b0;
  FString tmp;
  int local_1a0;
  uint uStack_19c;
  bool noluck;
  int j;
  int i;
  byte local_190;
  GF1PatchData patch_data;
  GF1LayerData layer_data;
  GF1InstrumentData idata;
  GF1PatchHeader header;
  FileReader *fp;
  Sample *sp;
  Instrument *ip;
  int strip_loop_local;
  int note_to_use_local;
  int panning_local;
  int percussion_local;
  char *name_local;
  Renderer *song_local;
  
  tmp.Chars._7_1_ = 0;
  if (name != (char *)0x0) {
    header.Reserved._28_8_ =
         PathExpander::openFileReader((PathExpander *)pathExpander,name,(int *)0x0);
    if ((FileReader *)header.Reserved._28_8_ == (FileReader *)0x0) {
      FString::FString(&local_1b0,name);
      FString::operator+=(&local_1b0,".pat");
      pcVar3 = FString::operator_cast_to_char_(&local_1b0);
      header.Reserved._28_8_ =
           PathExpander::openFileReader((PathExpander *)pathExpander,pcVar3,(int *)0x0);
      if ((FileReader *)header.Reserved._28_8_ == (FileReader *)0x0) {
        FString::ToUpper(&local_1b0);
        pcVar3 = FString::operator_cast_to_char_(&local_1b0);
        header.Reserved._28_8_ =
             PathExpander::openFileReader((PathExpander *)pathExpander,pcVar3,(int *)0x0);
        if ((FileReader *)header.Reserved._28_8_ == (FileReader *)0x0) {
          tmp.Chars._7_1_ = 1;
        }
      }
      FString::~FString(&local_1b0);
    }
    if ((tmp.Chars._7_1_ & 1) == 0) {
      cmsg(0,2,"Loading instrument %s\n",name);
      lVar4 = (**(code **)(*(long *)header.Reserved._28_8_ + 0x10))
                        (header.Reserved._28_8_,idata.Reserved + 0x20,0x81);
      if (lVar4 == 0x81) {
        iVar2 = strncmp((char *)(idata.Reserved + 0x20),"GF1PATCH110",8);
        if (iVar2 != 0) {
          cmsg(2,0,"%s: Not an instrument.\n",name);
          if (header.Reserved._28_8_ != 0) {
            (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
          }
          return (Instrument *)0x0;
        }
        iVar2 = strcmp(header.Header,"110");
        if (iVar2 < 0) {
          cmsg(2,0,"%s: Is an old and unsupported patch version.\n",name);
          if (header.Reserved._28_8_ != 0) {
            (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
          }
          return (Instrument *)0x0;
        }
        lVar4 = (**(code **)(*(long *)header.Reserved._28_8_ + 0x10))
                          (header.Reserved._28_8_,layer_data.Reserved + 0x20,0x3f);
        if (lVar4 == 0x3f) {
          if ((header.Description[0x34] != '\x01') && (header.Description[0x34] != '\0')) {
            cmsg(2,0,"Can\'t handle patches with %d instruments.\n",
                 (ulong)(byte)header.Description[0x34]);
            if (header.Reserved._28_8_ != 0) {
              (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
            }
            return (Instrument *)0x0;
          }
          if ((idata.InstrumentName[0xc] != '\x01') && (idata.InstrumentName[0xc] != '\0')) {
            cmsg(2,0,"Can\'t handle instruments with %d layers.\n",
                 (ulong)(byte)idata.InstrumentName[0xc]);
            if (header.Reserved._28_8_ != 0) {
              (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
            }
            return (Instrument *)0x0;
          }
          lVar4 = (**(code **)(*(long *)header.Reserved._28_8_ + 0x10))
                            (header.Reserved._28_8_,patch_data.Reserved + 0x1c,0x2f);
          if (lVar4 == 0x2f) {
            if (patch_data.Reserved[0x22] == '\0') {
              cmsg(2,0,"Instrument has 0 samples.\n");
              if (header.Reserved._28_8_ != 0) {
                (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
              }
              return (Instrument *)0x0;
            }
            this = (Instrument *)operator_new(0x10);
            Instrument::Instrument(this);
            this->samples = (uint)patch_data.Reserved[0x22];
            pSVar5 = (Sample *)safe_malloc((ulong)patch_data.Reserved[0x22] * 0x68);
            this->sample = pSVar5;
            memset(this->sample,0,(ulong)patch_data.Reserved[0x22] * 0x68);
            uStack_19c = 0;
            while( true ) {
              if ((int)(uint)patch_data.Reserved[0x22] <= (int)uStack_19c) {
                if (header.Reserved._28_8_ != 0) {
                  (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
                  return this;
                }
                return this;
              }
              lVar4 = (**(code **)(*(long *)header.Reserved._28_8_ + 0x10))
                                (header.Reserved._28_8_,(long)&j + 1,0x60);
              if (lVar4 != 0x60) break;
              pSVar5 = this->sample + (int)uStack_19c;
              pSVar5->data_length = patch_data.WaveName._0_4_;
              pSVar5->loop_start = patch_data._4_4_;
              pSVar5->loop_end = patch_data.WaveSize;
              pSVar5->sample_rate = (uint)(ushort)patch_data.StartLoop;
              pSVar5->low_freq = (float)(int)patch_data._14_4_;
              pSVar5->high_freq = (float)(int)patch_data._18_4_ + 0.9999;
              pSVar5->root_freq = (float)patch_data.LowFrequency;
              pSVar5->high_vel = '\x7f';
              pSVar5->velocity = -1;
              pSVar5->type = '\0';
              if (panning == -1) {
                pSVar5->panning =
                     (short)((ulong)((patch_data.HighFrequency._2_1_ & 0xf) * 1000) / 0xf) + -500;
              }
              else {
                pSVar5->panning = (short)((ulong)((panning & 0x7fU) * 1000) / 0x7f) + -500;
              }
              Renderer::compute_pan
                        ((double)(pSVar5->panning + 500) / 1000.0,0,&pSVar5->left_offset,
                         &pSVar5->right_offset);
              if ((patch_data.EnvelopeRate[5] == '\0') || (patch_data.EnvelopeOffset[0] == '\0')) {
                pSVar5->tremolo_sweep_increment = 0;
                pSVar5->tremolo_phase_increment = 0;
                pSVar5->tremolo_depth = '\0';
                cmsg(0,3," * no tremolo\n");
              }
              else {
                iVar2 = convert_tremolo_sweep(song,patch_data.EnvelopeRate[4]);
                pSVar5->tremolo_sweep_increment = iVar2;
                iVar2 = convert_tremolo_rate(song,patch_data.EnvelopeRate[5]);
                pSVar5->tremolo_phase_increment = iVar2;
                pSVar5->tremolo_depth = patch_data.EnvelopeOffset[0];
                cmsg(0,3," * tremolo: sweep %d, phase %d, depth %d\n",
                     (ulong)(uint)pSVar5->tremolo_sweep_increment,
                     (ulong)(uint)pSVar5->tremolo_phase_increment,(ulong)pSVar5->tremolo_depth);
              }
              if ((patch_data.EnvelopeOffset[2] == '\0') || (patch_data.EnvelopeOffset[3] == '\0'))
              {
                pSVar5->vibrato_sweep_increment = 0;
                pSVar5->vibrato_control_ratio = 0;
                pSVar5->vibrato_depth = '\0';
                cmsg(0,3," * no vibrato\n");
              }
              else {
                iVar2 = convert_vibrato_rate(song,patch_data.EnvelopeOffset[2]);
                pSVar5->vibrato_control_ratio = iVar2;
                iVar2 = convert_vibrato_sweep
                                  (song,patch_data.EnvelopeOffset[1],pSVar5->vibrato_control_ratio);
                pSVar5->vibrato_sweep_increment = iVar2;
                pSVar5->vibrato_depth = patch_data.EnvelopeOffset[3];
                cmsg(0,3," * vibrato: sweep %d, ctl %d, depth %d\n",
                     (ulong)(uint)pSVar5->vibrato_sweep_increment,
                     (ulong)(uint)pSVar5->vibrato_control_ratio,(ulong)pSVar5->vibrato_depth);
              }
              pSVar5->modes = (ushort)patch_data.EnvelopeOffset[4];
              if (note_to_use == -1) {
                pSVar5->scale_note = patch_data._48_2_;
                pSVar5->scale_factor = patch_data._50_2_;
                if (pSVar5->scale_factor < 3) {
                  pSVar5->scale_factor = pSVar5->scale_factor << 10;
                }
                else if (0x800 < pSVar5->scale_factor) {
                  pSVar5->scale_factor = 0x400;
                }
                if (pSVar5->scale_factor != 0x400) {
                  cmsg(0,3," * Scale: note %d, factor %d\n",(ulong)(uint)(int)pSVar5->scale_note,
                       (ulong)pSVar5->scale_factor);
                }
              }
              else {
                pSVar5->scale_note = (SWORD)note_to_use;
                pSVar5->scale_factor = 0;
              }
              local_1a0 = 0;
              while ((local_1a0 < 0x3c && (header.GravisID[(long)local_1a0 + 2] == '\0'))) {
                local_1a0 = local_1a0 + 1;
              }
              if (((strip_loop == 1) && ((pSVar5->modes & 0x3c) != 0)) &&
                 (cmsg(0,3," - Removing loop and/or sustain\n"), local_1a0 == 0x3c)) {
                pSVar5->modes = pSVar5->modes & 0xffc3;
              }
              if ((strip_envelope == 1) && (cmsg(0,3," - Removing envelope\n"), local_1a0 == 0x3c))
              {
                for (local_1c0 = 1; local_1c0 < 6; local_1c0 = local_1c0 + 1) {
                  if (patch_data.Tune._1_1_ < patch_data.EnvelopeRate[(long)local_1c0 + -2]) {
                    patch_data.Tune._1_1_ = patch_data.EnvelopeRate[(long)local_1c0 + -2];
                  }
                }
                for (local_1c0 = 0; local_1c0 < 6; local_1c0 = local_1c0 + 1) {
                  patch_data.EnvelopeRate[(long)local_1c0 + -8] = '?';
                  patch_data.EnvelopeRate[(long)local_1c0 + -2] = patch_data.Tune._1_1_;
                }
              }
              for (local_1a0 = 0; local_1a0 < 6; local_1a0 = local_1a0 + 1) {
                *(BYTE *)((long)&pSVar5->envelope + (long)local_1a0) =
                     patch_data.EnvelopeRate[(long)local_1a0 + -8];
                uVar1 = clamp<unsigned_char>
                                  (patch_data.EnvelopeRate[(long)local_1a0 + -2],'\x05',0xfb);
                *(uchar *)((long)&pSVar5->envelope + (long)local_1a0 + 6) = uVar1;
              }
              if ((((pSVar5->modes & 1) != 0) && (0x100000 < pSVar5->data_length / 2)) ||
                 (((pSVar5->modes & 1) == 0 && (0x100000 < pSVar5->data_length)))) break;
              psVar6 = (sample_t *)safe_malloc((long)pSVar5->data_length);
              pSVar5->data = psVar6;
              iVar2 = pSVar5->data_length;
              lVar4 = (**(code **)(*(long *)header.Reserved._28_8_ + 0x10))
                                (header.Reserved._28_8_,pSVar5->data,(long)pSVar5->data_length);
              if (iVar2 != lVar4) break;
              convert_sample_data(pSVar5,pSVar5->data);
              if ((pSVar5->modes & 0x10) != 0) {
                cmsg(1,0,"Reverse loop in %s\n",name);
                reverse_data(pSVar5->data,0,pSVar5->data_length);
                pSVar5->data[pSVar5->data_length] = pSVar5->data[pSVar5->data_length + -1];
                iVar2 = pSVar5->loop_start;
                pSVar5->loop_start = pSVar5->data_length - pSVar5->loop_end;
                pSVar5->loop_end = pSVar5->data_length - iVar2;
                pSVar5->modes = pSVar5->modes & 0xffef;
                pSVar5->modes = pSVar5->modes | 4;
              }
              pSVar5->data_length = pSVar5->data_length << 0xc;
              pSVar5->loop_start = pSVar5->loop_start << 0xc;
              pSVar5->loop_end = pSVar5->loop_end << 0xc;
              pSVar5->loop_start = (local_190 & 0xf) << 8 | pSVar5->loop_start;
              pSVar5->loop_end = (local_190 & 0xf0) << 4 | pSVar5->loop_end;
              if ((pSVar5->scale_factor == 0) && ((pSVar5->modes & 4) == 0)) {
                pre_resample(song,pSVar5);
              }
              if (strip_tail == 1) {
                cmsg(0,3," - Stripping tail\n");
                pSVar5->data_length = pSVar5->loop_end;
              }
              uStack_19c = uStack_19c + 1;
            }
            cmsg(2,0,"Error reading sample %d.\n",(ulong)uStack_19c);
            if (this != (Instrument *)0x0) {
              Instrument::~Instrument(this);
              operator_delete(this,0x10);
            }
            if (header.Reserved._28_8_ != 0) {
              (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
            }
            return (Instrument *)0x0;
          }
        }
      }
      cmsg(2,0,"%s: Error reading instrument.\n",name);
      if (header.Reserved._28_8_ != 0) {
        (**(code **)(*(long *)header.Reserved._28_8_ + 8))();
      }
    }
    else {
      cmsg(2,0,"Instrument `%s\' can\'t be found.\n",name);
    }
  }
  return (Instrument *)0x0;
}

Assistant:

static Instrument *load_instrument(Renderer *song, const char *name, int percussion,
					int panning, int note_to_use,
					int strip_loop, int strip_envelope,
					int strip_tail)
{
	Instrument *ip;
	Sample *sp;
	FileReader *fp;
	GF1PatchHeader header;
	GF1InstrumentData idata;
	GF1LayerData layer_data;
	GF1PatchData patch_data;
	int i, j;
	bool noluck = false;

	if (!name) return 0;

	/* Open patch file */
	if ((fp = pathExpander.openFileReader(name, NULL)) == NULL)
	{
		/* Try with various extensions */
		FString tmp = name;
		tmp += ".pat";
		if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
		{
#ifdef __unix__			// Windows isn't case-sensitive.
			tmp.ToUpper();
			if ((fp = pathExpander.openFileReader(tmp, NULL)) == NULL)
#endif
			{
				noluck = true;
			}
		}
	}

	if (noluck)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument `%s' can't be found.\n", name);
		return 0;
	}

	cmsg(CMSG_INFO, VERB_NOISY, "Loading instrument %s\n", name);

	/* Read some headers and do cursory sanity checks. */

	if (sizeof(header) != fp->Read(&header, sizeof(header)))
	{
failread:
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Error reading instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strncmp(header.Header, GF1_HEADER_TEXT, HEADER_SIZE - 4) != 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Not an instrument.\n", name);
		delete fp;
		return 0;
	}
	if (strcmp(header.Header + 8, "110") < 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "%s: Is an old and unsupported patch version.\n", name);
		delete fp;
		return 0;
	}
	if (sizeof(idata) != fp->Read(&idata, sizeof(idata)))
	{
		goto failread;
	}

	header.WaveForms = LittleShort(header.WaveForms);
	header.MasterVolume = LittleShort(header.MasterVolume);
	header.DataSize = LittleLong(header.DataSize);
	idata.Instrument = LittleShort(idata.Instrument);

	if (header.Instruments != 1 && header.Instruments != 0) /* instruments. To some patch makers, 0 means 1 */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle patches with %d instruments.\n", header.Instruments);
		delete fp;
		return 0;
	}

	if (idata.Layers != 1 && idata.Layers != 0) /* layers. What's a layer? */
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Can't handle instruments with %d layers.\n", idata.Layers);
		delete fp;
		return 0;
	}

	if (sizeof(layer_data) != fp->Read(&layer_data, sizeof(layer_data)))
	{
		goto failread;
	}

	if (layer_data.Samples == 0)
	{
		cmsg(CMSG_ERROR, VERB_NORMAL, "Instrument has 0 samples.\n");
		delete fp;
		return 0;
	}

	ip = new Instrument;
	ip->samples = layer_data.Samples;
	ip->sample = (Sample *)safe_malloc(sizeof(Sample) * layer_data.Samples);
	memset(ip->sample, 0, sizeof(Sample) * layer_data.Samples);
	for (i = 0; i < layer_data.Samples; ++i)
	{
		if (sizeof(patch_data) != fp->Read(&patch_data, sizeof(patch_data)))
		{
fail:
			cmsg(CMSG_ERROR, VERB_NORMAL, "Error reading sample %d.\n", i);
			delete ip;
			delete fp;
			return 0;
		}

		sp = &(ip->sample[i]);

		sp->data_length = LittleLong(patch_data.WaveSize);
		sp->loop_start = LittleLong(patch_data.StartLoop);
		sp->loop_end = LittleLong(patch_data.EndLoop);
		sp->sample_rate = LittleShort(patch_data.SampleRate);
		sp->low_freq = float(LittleLong(patch_data.LowFrequency));
		sp->high_freq = float(LittleLong(patch_data.HighFrequency)) + 0.9999f;
		sp->root_freq = float(LittleLong(patch_data.RootFrequency));
		sp->high_vel = 127;
		sp->velocity = -1;
		sp->type = INST_GUS;

		// Expand to SF2 range.
		if (panning == -1)
		{
			sp->panning = (patch_data.Balance & 0x0F) * 1000 / 15 - 500;
		}
		else
		{
			sp->panning = (panning & 0x7f) * 1000 / 127 - 500;
		}
		song->compute_pan((sp->panning + 500) / 1000.0, INST_GUS, sp->left_offset, sp->right_offset);

		/* tremolo */
		if (patch_data.TremoloRate == 0 || patch_data.TremoloDepth == 0)
		{
			sp->tremolo_sweep_increment = 0;
			sp->tremolo_phase_increment = 0;
			sp->tremolo_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no tremolo\n");
		}
		else
		{
			sp->tremolo_sweep_increment = convert_tremolo_sweep(song, patch_data.TremoloSweep);
			sp->tremolo_phase_increment = convert_tremolo_rate(song, patch_data.TremoloRate);
			sp->tremolo_depth = patch_data.TremoloDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * tremolo: sweep %d, phase %d, depth %d\n",
				sp->tremolo_sweep_increment, sp->tremolo_phase_increment, sp->tremolo_depth);
		}

		/* vibrato */
		if (patch_data.VibratoRate == 0 || patch_data.VibratoDepth == 0)
		{
			sp->vibrato_sweep_increment = 0;
			sp->vibrato_control_ratio = 0;
			sp->vibrato_depth = 0;
			cmsg(CMSG_INFO, VERB_DEBUG, " * no vibrato\n");
		}
		else
		{
			sp->vibrato_control_ratio = convert_vibrato_rate(song, patch_data.VibratoRate);
			sp->vibrato_sweep_increment = convert_vibrato_sweep(song, patch_data.VibratoSweep, sp->vibrato_control_ratio);
			sp->vibrato_depth = patch_data.VibratoDepth;
			cmsg(CMSG_INFO, VERB_DEBUG, " * vibrato: sweep %d, ctl %d, depth %d\n",
				sp->vibrato_sweep_increment, sp->vibrato_control_ratio, sp->vibrato_depth);
		}

		sp->modes = patch_data.Modes;

		/* Mark this as a fixed-pitch instrument if such a deed is desired. */
		if (note_to_use != -1)
		{
			sp->scale_note = note_to_use;
			sp->scale_factor = 0;
		}
		else
		{
			sp->scale_note = LittleShort(patch_data.ScaleFrequency);
			sp->scale_factor = LittleShort(patch_data.ScaleFactor);
			if (sp->scale_factor <= 2)
			{
				sp->scale_factor *= 1024;
			}
			else if (sp->scale_factor > 2048)
			{
				sp->scale_factor = 1024;
			}
			if (sp->scale_factor != 1024)
			{
				cmsg(CMSG_INFO, VERB_DEBUG, " * Scale: note %d, factor %d\n",
					sp->scale_note, sp->scale_factor);
			}
		}

#if 0
		/* seashore.pat in the Midia patch set has no Sustain. I don't
		   understand why, and fixing it by adding the Sustain flag to
		   all looped patches probably breaks something else. We do it
		   anyway. */

		if (sp->modes & PATCH_LOOPEN) 
		{
			sp->modes |= PATCH_SUSTAIN;
		}
#endif
		/* [RH] Alas, eawpats has percussion instruments with bad envelopes. :(
		 * (See cymchina.pat for one example of this sadness.)
		 * Do this logic for instruments without a description, only. Hopefully that
		 * catches all the patches that need it without including any extra.
		 */
		for (j = 0; j < DESC_SIZE; ++j)
		{
			if (header.Description[j] != 0)
				break;
		}
		/* Strip any loops and envelopes we're permitted to */
		/* [RH] (But PATCH_BACKWARD isn't a loop flag at all!) */
		if ((strip_loop == 1) && 
			(sp->modes & (PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD)))
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing loop and/or sustain\n");
			if (j == DESC_SIZE)
			{
				sp->modes &= ~(PATCH_SUSTAIN | PATCH_LOOPEN | PATCH_BIDIR | PATCH_BACKWARD);
			}
		}

		if (strip_envelope == 1)
		{
			cmsg(CMSG_INFO, VERB_DEBUG, " - Removing envelope\n");
			/* [RH] The envelope isn't really removed, but this is the way the standard
			 * Gravis patches get that effect: All rates at maximum, and all offsets at
			 * a constant level.
			 */
			if (j == DESC_SIZE)
			{
				int k;
				for (k = 1; k < ENVELOPES; ++k)
				{ /* Find highest offset. */
					if (patch_data.EnvelopeOffset[k] > patch_data.EnvelopeOffset[0])
					{
						patch_data.EnvelopeOffset[0] = patch_data.EnvelopeOffset[k];
					}
				}
				for (k = 0; k < ENVELOPES; ++k)
				{
					patch_data.EnvelopeRate[k] = 63;
					patch_data.EnvelopeOffset[k] = patch_data.EnvelopeOffset[0];
				}
			}
		}

		for (j = 0; j < 6; j++)
		{
			sp->envelope.gf1.rate[j] = patch_data.EnvelopeRate[j];
			/* [RH] GF1NEW clamps the offsets to the range [5,251], so we do too. */
			sp->envelope.gf1.offset[j] = clamp<BYTE>(patch_data.EnvelopeOffset[j], 5, 251);
		}

		/* Then read the sample data */
		if (((sp->modes & PATCH_16) && sp->data_length/2 > MAX_SAMPLE_SIZE) ||
			(!(sp->modes & PATCH_16) && sp->data_length > MAX_SAMPLE_SIZE))
		{
			goto fail;
		}
		sp->data = (sample_t *)safe_malloc(sp->data_length);

		if (sp->data_length != fp->Read(sp->data, sp->data_length))
			goto fail;

		convert_sample_data(sp, sp->data);

		/* Reverse reverse loops and pass them off as normal loops */
		if (sp->modes & PATCH_BACKWARD)
		{
			int t;
			/* The GUS apparently plays reverse loops by reversing the
			   whole sample. We do the same because the GUS does not SUCK. */

			cmsg(CMSG_WARNING, VERB_NORMAL, "Reverse loop in %s\n", name);
			reverse_data((sample_t *)sp->data, 0, sp->data_length);
			sp->data[sp->data_length] = sp->data[sp->data_length - 1];

			t = sp->loop_start;
			sp->loop_start = sp->data_length - sp->loop_end;
			sp->loop_end = sp->data_length - t;

			sp->modes &= ~PATCH_BACKWARD;
			sp->modes |= PATCH_LOOPEN; /* just in case */
		}

		/* Then fractional samples */
		sp->data_length <<= FRACTION_BITS;
		sp->loop_start <<= FRACTION_BITS;
		sp->loop_end <<= FRACTION_BITS;

		/* Adjust for fractional loop points. */
		sp->loop_start |= (patch_data.Fractions & 0x0F) << (FRACTION_BITS-4);
		sp->loop_end   |= (patch_data.Fractions & 0xF0) << (FRACTION_BITS-4-4);

		/* If this instrument will always be played on the same note,
		   and it's not looped, we can resample it now. */
		if (sp->scale_factor == 0 && !(sp->modes & PATCH_LOOPEN))
		{
			pre_resample(song, sp);
		}

		if (strip_tail == 1)
		{
			/* Let's not really, just say we did. */
			cmsg(CMSG_INFO, VERB_DEBUG, " - Stripping tail\n");
			sp->data_length = sp->loop_end;
		}
	}
	delete fp;
	return ip;
}